

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flt2vrml.c
# Opt level: O3

int profitCB(void *mystate,void *ud)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  uint16_t uVar5;
  uint item;
  int iVar6;
  int iVar7;
  bool_t bVar8;
  uint uVar9;
  prf_node_t *ppVar10;
  uint32_t *puVar11;
  undefined8 *item_00;
  void *pvVar12;
  int *piVar13;
  size_t sVar14;
  char *__dest;
  matrix4x4_f32_t *m;
  long lVar15;
  void **ppvVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  prf_vertex_s vertex;
  float local_120;
  float fStack_11c;
  float fStack_118;
  ulong local_110;
  undefined1 local_108 [16];
  double local_f8;
  ushort local_f0;
  ushort local_ee;
  float local_e0;
  float local_dc;
  uint local_d8;
  int local_cc;
  
  ppVar10 = *(prf_node_t **)((long)mystate + 8);
  uVar5 = ppVar10->opcode;
  if (uVar5 == 0x3e) {
    return 2;
  }
  if (uVar5 == 0x3d) {
    ppVar10 = prf_state_get_instance_from_node((prf_state_t *)mystate,ppVar10);
    if (ppVar10 == (prf_node_t *)0x0) {
      array_count(*(void **)((long)mystate + 0x40));
    }
    else {
      uVar9 = array_count(ppVar10->children);
      prf_state_push((prf_state_t *)mystate);
      if (0 < (int)uVar9) {
        uVar18 = 0;
        do {
          prf_model_traverse_io_(ppVar10->children[uVar18],(prf_state_t *)mystate);
          uVar18 = uVar18 + 1;
        } while (uVar9 != uVar18);
      }
      prf_state_pop((prf_state_t *)mystate);
    }
  }
  else {
    if ((uVar5 == 2) && ((ppVar10->data[0xf] & 0x60) != 0)) {
      prf_state_push((prf_state_t *)mystate);
      prf_model_traverse_io_
                (*(prf_node_t **)(*(long *)(*(long *)((long)mystate + 8) + 0x10) + 8),
                 (prf_state_t *)mystate);
      prf_state_pop((prf_state_t *)mystate);
      return 2;
    }
    prf_nodeinfo_get(uVar5);
    ppVar10 = *(prf_node_t **)((long)mystate + 8);
    uVar5 = ppVar10->opcode;
    if (uVar5 == 5) {
      vertexarray = (float *)_array_set_count(vertexarray,0);
      texcoordarray = (float *)_array_set_count(texcoordarray,0);
      colorarray = (int *)_array_set_count(colorarray,0);
      lVar19 = *(long *)(*(long *)((long)mystate + 8) + 8);
      if ((*(uint *)(lVar19 + 0x28) >> 0x1a & 1) != 0) {
        return 2;
      }
      profitCB_is_in_face = 1;
      profitCB_color_per_vertex = (*(byte *)(lVar19 + 0x2c) | 2) == 3;
      if ((*(uint *)(lVar19 + 0x28) & 0x50000000) == 0) {
        if (ofversion < 0x5dc) {
          uVar9 = (uint)*(ushort *)(lVar19 + 0x10);
        }
        else {
          uVar9 = *(uint *)(lVar19 + 0x40);
        }
        uVar9 = my_palette_lookup((prf_state_t *)mystate,uVar9);
      }
      else {
        uVar9 = *(uint *)(lVar19 + 0x34);
      }
      sVar2 = *(short *)(lVar19 + 0x18);
      sVar3 = *(short *)(lVar19 + 0x1a);
      iVar17 = (uint)*(ushort *)((long)mystate + 0x74) * (uint)*(ushort *)(lVar19 + 0x24);
      bVar1 = *(byte *)(lVar19 + 0x2c);
      local_120 = (float)uVar9;
      fStack_11c = (float)(int)sVar3 * 65536.0 + (float)(int)sVar2;
      fStack_118 = (float)*(ushort *)((long)mystate + 0x78) * 65536.0 * 256.0 +
                   (float)bVar1 * 65536.0 + (float)(iVar17 >> 0x10);
      iVar6 = bsp_add_point(materialLookup,&local_120);
      profitCB::current_index = iVar6;
      iVar7 = array_count(facesets);
      if (iVar7 <= iVar6) {
        item_00 = (undefined8 *)malloc(0xa0);
        pvVar12 = bsp_create(3);
        *item_00 = pvVar12;
        pvVar12 = bsp_create(2);
        item_00[1] = pvVar12;
        piVar13 = array_create_int(4);
        item_00[3] = piVar13;
        piVar13 = array_create_int(4);
        item_00[4] = piVar13;
        piVar13 = array_create_int(4);
        item_00[5] = piVar13;
        piVar13 = array_create_int(4);
        item_00[2] = piVar13;
        pvVar12 = bsp_create(3);
        item_00[6] = pvVar12;
        *(uint *)(item_00 + 7) = uVar9;
        *(short *)((long)item_00 + 0x3c) = sVar2;
        item_00[8] = 0;
        *(uint *)((long)item_00 + 0x9c) = (uint)*(ushort *)((long)mystate + 0x78);
        if (((-1 < sVar2) &&
            (bVar8 = prf_state_texture_lookup
                               ((prf_state_t *)mystate,(int)sVar2,(prf_texture_t *)local_108),
            bVar8 != 0)) && (sVar14 = strlen(local_108), sVar14 != 0)) {
          __dest = (char *)malloc(sVar14 + 1);
          item_00[8] = __dest;
          strcpy(__dest,local_108);
        }
        *(short *)(item_00 + 9) = sVar3;
        *(short *)((long)item_00 + 0x4a) = (short)((uint)iVar17 >> 0x10);
        *(ushort *)((long)item_00 + 0x4c) = (ushort)bVar1;
        bVar8 = prf_state_material_lookup
                          ((prf_state_t *)mystate,(int)sVar3,(prf_material_t *)(item_00 + 10));
        if (bVar8 == 0) {
          *(undefined8 *)((long)item_00 + 0x74) = 0x3f8000003f800000;
          *(undefined8 *)((long)item_00 + 0x7c) = 0x3f8000003f800000;
          *(undefined8 *)((long)item_00 + 100) = 0x3e4ccccd3e4ccccd;
          *(undefined8 *)((long)item_00 + 0x6c) = 0x3f8000003e4ccccd;
          auVar23._0_12_ = ZEXT812(0x3f800000);
          auVar23._12_4_ = 0;
          *(undefined1 (*) [16])((long)item_00 + 0x84) = auVar23;
          *(undefined8 *)((long)item_00 + 0x94) = 0x3f80000041cccccd;
        }
        facesets = _array_append_ptr(facesets,item_00);
      }
      pvVar12 = *(void **)(*(long *)((long)mystate + 8) + 0x10);
      if (pvVar12 != (void *)0x0) {
        uVar9 = array_count(pvVar12);
        prf_state_push((prf_state_t *)mystate);
        if ((int)uVar9 < 1) {
          prf_state_pop((prf_state_t *)mystate);
          prf_state_push((prf_state_t *)mystate);
        }
        else {
          uVar18 = 0;
          bVar4 = false;
          do {
            ppVar10 = *(prf_node_t **)((long)pvVar12 + uVar18 * 8);
            uVar5 = ppVar10->opcode;
            if (uVar5 == 0x13) {
              bVar4 = true;
            }
            if (!bVar4) {
              prf_model_traverse_io_(ppVar10,(prf_state_t *)mystate);
              uVar5 = **(uint16_t **)((long)pvVar12 + uVar18 * 8);
            }
            if (uVar5 == 0x14) {
              bVar4 = false;
            }
            uVar18 = uVar18 + 1;
          } while (uVar9 != uVar18);
          prf_state_pop((prf_state_t *)mystate);
          prf_state_push((prf_state_t *)mystate);
          if (0 < (int)uVar9) {
            uVar18 = 0;
            bVar4 = false;
            do {
              ppVar10 = *(prf_node_t **)((long)pvVar12 + uVar18 * 8);
              uVar5 = ppVar10->opcode;
              if (uVar5 == 0x13) {
                bVar4 = true;
              }
              if (bVar4) {
                prf_model_traverse_io_(ppVar10,(prf_state_t *)mystate);
                uVar5 = **(uint16_t **)((long)pvVar12 + uVar18 * 8);
              }
              if (uVar5 == 0x14) {
                bVar4 = false;
              }
              uVar18 = uVar18 + 1;
            } while (uVar9 != uVar18);
          }
        }
        prf_state_pop((prf_state_t *)mystate);
      }
      return 2;
    }
    if (uVar5 == 0x48 && (~profitCB_is_in_face & 1) == 0) {
      uVar9 = prf_vertex_list_get_count(ppVar10);
      puVar11 = prf_vertex_list_get_list_ptr(*(prf_node_t **)((long)mystate + 8));
      if ((int)uVar9 < 1) {
        return 1;
      }
      uVar18 = 0;
      do {
        prf_model_vertex_palette_lookup(currmodel,puVar11[uVar18],(prf_vertex_t *)local_108);
        vertexarray = _array_append_float(vertexarray,(float)(double)local_108._0_8_);
        vertexarray = _array_append_float(vertexarray,(float)(double)local_108._8_8_);
        vertexarray = _array_append_float(vertexarray,(float)local_f8);
        if (local_cc == 0) {
          texcoordarray = _array_append_float(texcoordarray,0.0);
          fVar21 = 0.0;
        }
        else {
          texcoordarray = _array_append_float(texcoordarray,local_e0);
          fVar21 = local_dc;
        }
        texcoordarray = _array_append_float(texcoordarray,fVar21);
        piVar13 = colorarray;
        if (profitCB_color_per_vertex == '\x01') {
          if ((local_ee >> 0xd & 1) == 0) {
            item = local_d8;
            if ((local_ee >> 0xc & 1) == 0) {
              item = my_palette_lookup((prf_state_t *)mystate,(uint)local_f0);
            }
          }
          else {
            item = *(uint *)((long)facesets[profitCB::current_index] + 0x38);
          }
          colorarray = _array_append_int(piVar13,item);
        }
        uVar18 = uVar18 + 1;
      } while (uVar9 != uVar18);
    }
    else {
      if ((profitCB_is_in_face & 1) == 0) {
        return 1;
      }
      if (uVar5 == 0x59) {
        iVar6 = prf_morph_vertex_list_get_count(ppVar10);
        puVar11 = prf_morph_vertex_list_get_list_ptr(*(prf_node_t **)((long)mystate + 8));
        if (0 < iVar6) {
          uVar18 = 0;
          do {
            prf_model_vertex_palette_lookup(currmodel,puVar11[uVar18],(prf_vertex_t *)local_108);
            vertexarray = _array_append_float(vertexarray,(float)(double)local_108._0_8_);
            vertexarray = _array_append_float(vertexarray,(float)(double)local_108._8_8_);
            vertexarray = _array_append_float(vertexarray,(float)local_f8);
            if (local_cc == 0) {
              texcoordarray = _array_append_float(texcoordarray,0.0);
              fVar21 = 0.0;
            }
            else {
              texcoordarray = _array_append_float(texcoordarray,local_e0);
              fVar21 = local_dc;
            }
            texcoordarray = _array_append_float(texcoordarray,fVar21);
            piVar13 = colorarray;
            if (profitCB_color_per_vertex == '\x01') {
              if ((local_ee >> 0xd & 1) == 0) {
                uVar9 = local_d8;
                if ((local_ee >> 0xc & 1) == 0) {
                  uVar9 = my_palette_lookup((prf_state_t *)mystate,(uint)local_f0);
                }
              }
              else {
                uVar9 = *(uint *)((long)facesets[profitCB::current_index] + 0x38);
              }
              colorarray = _array_append_int(piVar13,uVar9);
            }
            uVar18 = uVar18 + 2;
          } while (uVar18 < (uint)(iVar6 * 2));
        }
      }
      else {
        bVar8 = prf_vertex_lookup(ppVar10,(prf_vertex_t *)local_108);
        if (bVar8 != 0) {
          vertexarray = _array_append_float(vertexarray,(float)(double)local_108._0_8_);
          vertexarray = _array_append_float(vertexarray,(float)(double)local_108._8_8_);
          vertexarray = _array_append_float(vertexarray,(float)local_f8);
          texcoordarray = _array_append_float(texcoordarray,0.0);
          texcoordarray = _array_append_float(texcoordarray,0.0);
          piVar13 = colorarray;
          if (profitCB_color_per_vertex != '\x01') {
            return 1;
          }
          if ((local_ee >> 0xd & 1) == 0) {
            if ((local_ee >> 0xc & 1) == 0) {
              local_d8 = my_palette_lookup((prf_state_t *)mystate,(uint)local_f0);
            }
          }
          else {
            local_d8 = *(uint *)((long)facesets[profitCB::current_index] + 0x38);
          }
          colorarray = _array_append_int(piVar13,local_d8);
          return 1;
        }
        if (profitCB_is_in_face != 1) {
          return 1;
        }
        if (**(short **)((long)mystate + 8) != 0xb) {
          return 1;
        }
        profitCB_is_in_face = 0;
        m = prf_state_get_matrix((prf_state_t *)mystate);
        iVar6 = array_count(vertexarray);
        if (iVar6 == 3) {
          return 1;
        }
        iVar6 = array_count(vertexarray);
        if (iVar6 != 6) {
          iVar6 = array_count(vertexarray);
          if (iVar6 < 9) {
            return 1;
          }
          sVar2 = *(short *)((long)facesets[profitCB::current_index] + 0x3c);
          uVar9 = array_count(vertexarray);
          uVar18 = (ulong)(uint)profitCB::current_index;
          ppvVar16 = facesets;
          iVar6 = profitCB::current_index;
          if (2 < (int)uVar9) {
            local_110 = (ulong)uVar9 / 3;
            lVar19 = 8;
            uVar20 = 0;
            do {
              local_120 = *(float *)((long)vertexarray + lVar19 + -8);
              fStack_11c = *(float *)((long)vertexarray + lVar19 + -4);
              fStack_118 = *(float *)((long)vertexarray + lVar19);
              mult_matrix_vec((float *)m,&local_120);
              piVar13 = *(int **)((long)ppvVar16[(int)uVar18] + 0x18);
              iVar6 = bsp_add_point(*(void **)((long)ppvVar16[(int)uVar18] + 0x30),&local_120);
              piVar13 = _array_append_int(piVar13,iVar6);
              ppvVar16 = facesets;
              uVar18 = (ulong)(uint)profitCB::current_index;
              lVar15 = (long)profitCB::current_index;
              *(int **)((long)facesets[lVar15] + 0x18) = piVar13;
              if (-1 < sVar2) {
                local_120 = texcoordarray[uVar20 * 2];
                fStack_11c = texcoordarray[uVar20 * 2 + 1];
                fStack_118 = texcoordarray[uVar20 * 2 + 2];
                piVar13 = *(int **)((long)ppvVar16[lVar15] + 0x28);
                iVar6 = bsp_add_point(*(void **)((long)ppvVar16[lVar15] + 8),&local_120);
                piVar13 = _array_append_int(piVar13,iVar6);
                ppvVar16 = facesets;
                uVar18 = (ulong)profitCB::current_index;
                *(int **)((long)facesets[uVar18] + 0x28) = piVar13;
              }
              if (profitCB_color_per_vertex == '\x01') {
                uVar9 = colorarray[uVar20];
                auVar25._0_4_ = (float)(uVar9 & 0xff);
                auVar25._4_4_ = (float)(uVar9 & 0xff00);
                auVar25._8_8_ = 0;
                auVar23 = divps(auVar25,_DAT_00110090);
                local_120 = auVar23._0_4_;
                fStack_11c = auVar23._4_4_;
                fStack_118 = (float)(uVar9 & 0xff0000) / 1.671168e+07;
                piVar13 = *(int **)((long)ppvVar16[(int)uVar18] + 0x10);
                iVar6 = bsp_add_point(*ppvVar16[(int)uVar18],&local_120);
                piVar13 = _array_append_int(piVar13,iVar6);
                ppvVar16 = facesets;
                uVar18 = (ulong)profitCB::current_index;
                *(int **)((long)facesets[uVar18] + 0x10) = piVar13;
              }
              iVar6 = (int)uVar18;
              uVar20 = uVar20 + 1;
              lVar19 = lVar19 + 0xc;
            } while (local_110 != uVar20);
          }
          piVar13 = _array_append_int(*(int **)((long)ppvVar16[iVar6] + 0x18),-1);
          ppvVar16 = facesets;
          iVar6 = profitCB::current_index;
          lVar19 = (long)profitCB::current_index;
          *(int **)((long)facesets[lVar19] + 0x18) = piVar13;
          if (-1 < sVar2) {
            piVar13 = _array_append_int(*(int **)((long)ppvVar16[lVar19] + 0x28),-1);
            ppvVar16 = facesets;
            iVar6 = profitCB::current_index;
            *(int **)((long)facesets[profitCB::current_index] + 0x28) = piVar13;
          }
          if (profitCB_color_per_vertex != '\x01') {
            return 1;
          }
          piVar13 = _array_append_int(*(int **)((long)ppvVar16[iVar6] + 0x10),-1);
          *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar13;
          return 1;
        }
        local_120 = *vertexarray;
        fStack_11c = vertexarray[1];
        fStack_118 = vertexarray[2];
        mult_matrix_vec((float *)m,&local_120);
        piVar13 = *(int **)((long)facesets[profitCB::current_index] + 0x20);
        iVar6 = bsp_add_point(*(void **)((long)facesets[profitCB::current_index] + 0x30),&local_120)
        ;
        piVar13 = _array_append_int(piVar13,iVar6);
        ppvVar16 = facesets;
        lVar19 = (long)profitCB::current_index;
        *(int **)((long)facesets[lVar19] + 0x20) = piVar13;
        local_120 = vertexarray[3];
        fStack_11c = vertexarray[4];
        fStack_118 = vertexarray[5];
        mult_matrix_vec((float *)m,&local_120);
        piVar13 = *(int **)((long)ppvVar16[lVar19] + 0x20);
        iVar6 = bsp_add_point(*(void **)((long)ppvVar16[lVar19] + 0x30),&local_120);
        piVar13 = _array_append_int(piVar13,iVar6);
        ppvVar16 = facesets;
        lVar19 = (long)profitCB::current_index;
        *(int **)((long)facesets[lVar19] + 0x20) = piVar13;
        piVar13 = _array_append_int(*(int **)((long)ppvVar16[lVar19] + 0x20),-1);
        ppvVar16 = facesets;
        lVar19 = (long)profitCB::current_index;
        *(int **)((long)facesets[lVar19] + 0x20) = piVar13;
        if (profitCB_color_per_vertex == '\x01') {
          uVar9 = *colorarray;
          auVar22._0_4_ = (float)(uVar9 & 0xff);
          auVar22._4_4_ = (float)(uVar9 & 0xff00);
          auVar22._8_8_ = 0;
          auVar23 = divps(auVar22,_DAT_00110090);
          local_120 = auVar23._0_4_;
          fStack_11c = auVar23._4_4_;
          fStack_118 = (float)(uVar9 & 0xff0000) / 1.671168e+07;
          piVar13 = *(int **)((long)ppvVar16[lVar19] + 0x10);
          iVar6 = bsp_add_point(*ppvVar16[lVar19],&local_120);
          piVar13 = _array_append_int(piVar13,iVar6);
          ppvVar16 = facesets;
          lVar19 = (long)profitCB::current_index;
          *(int **)((long)facesets[lVar19] + 0x10) = piVar13;
          uVar9 = colorarray[1];
          auVar24._0_4_ = (float)(uVar9 & 0xff);
          auVar24._4_4_ = (float)(uVar9 & 0xff00);
          auVar24._8_8_ = 0;
          auVar23 = divps(auVar24,_DAT_00110090);
          local_120 = auVar23._0_4_;
          fStack_11c = auVar23._4_4_;
          fStack_118 = (float)(uVar9 & 0xff0000) / 1.671168e+07;
          piVar13 = *(int **)((long)ppvVar16[lVar19] + 0x10);
          iVar6 = bsp_add_point(*ppvVar16[lVar19],&local_120);
          piVar13 = _array_append_int(piVar13,iVar6);
          ppvVar16 = facesets;
          lVar19 = (long)profitCB::current_index;
          *(int **)((long)facesets[lVar19] + 0x10) = piVar13;
          piVar13 = _array_append_int(*(int **)((long)ppvVar16[lVar19] + 0x10),-1);
          *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar13;
        }
      }
    }
  }
  return 1;
}

Assistant:

static int
profitCB(void *mystate, void *ud)
{
  static int is_in_face = 0;
  static int current_index = -1;
  static int color_per_vertex = 0;
  prf_nodeinfo_t *info;
  int i,n;
  float tmp[3];
  prf_node_t **children;
  struct prf_vertex_s vertex;

  prf_state_t * state = (prf_state_t *)mystate;

  if (state->node->opcode == GROUP_OPCODE) {
    struct prf_group_data *data = (struct prf_group_data*) state->node->data;
    if (data->flags & PRF_GROUP_FLAG_ANIMATION) {
      assert(state->node->children && array_count(state->node->children) > 2);
      prf_state_push(state);
      prf_model_traverse_io_(state->node->children[1], state);
      prf_state_pop(state);
      return PRF_TRAV_SIBLING;
    }
  }
  else if (state->node->opcode == DEF_OPCODE) {
    return PRF_TRAV_SIBLING;
  }
  else if (state->node->opcode == REF_OPCODE) {
    prf_node_t *node = prf_state_get_instance_from_node(state, state->node);
    if (node) {
      int i, n = array_count(node->children);
      prf_state_push(state);
      for (i = 0; i < n; i++) {
	prf_model_traverse_io_(node->children[i], state);
      }
      prf_state_pop(state);
    }
    else {
      int n = array_count(state->instances);
    }
    assert(node);
    return PRF_TRAV_CONTINUE;
  }

  info = prf_nodeinfo_get(state->node->opcode);

  if (state->node->opcode == FACE_OPCODE) {
    struct prf_face_data *face;
    unsigned int packed_color;
    unsigned short lightmode;
    int idx;

    vertexarray=(float *)_array_set_count(vertexarray, 0);
    texcoordarray=(float *)_array_set_count(texcoordarray, 0);
    colorarray=(int *)_array_set_count(colorarray, 0);

    face = (struct prf_face_data*) state->node->data;

    if (!(face->flags & PRF_FACE_FLAGS_HIDDEN)) {
      short texture_pattern_index;
      short material_index;
      unsigned short transparency;
      is_in_face = 1;
      color_per_vertex = 0;
      if (face->light_mode == 1 || face->light_mode == 3) {
        color_per_vertex = 1;
      }

      packed_color = face->color_name_index;

      if (face->flags & 0x50000000) {
        packed_color = face->packed_color_primary;
      }
      else {
        if (ofversion < 1500) {
          packed_color = my_palette_lookup(state, face->color_name_index);
        }
        else {
          packed_color = my_palette_lookup(state, face->primary_color_index);
        }
      }
      texture_pattern_index = face->texture_pattern_index;
      material_index = face->material_index;

      transparency = (unsigned short)
        (((int32_t)(face->transparency) *
          (int32_t)(state->object_transparency)) >> 16);

      lightmode = face->light_mode;

      tmp[0] = (float) packed_color;
      tmp[1] = (float) texture_pattern_index +
        (float) material_index * 65536.0f;
      tmp[2] = (float) transparency +
        (float) lightmode * 65536.0f +
        (float) state->subface_level * 65536.0f * 256.0f;

      idx = bsp_add_point(materialLookup, tmp);
      current_index = idx;

      if (idx >= array_count(facesets)) {
        faceset *data = faceset_create();

        data->packed_color = packed_color;
        data->texture_pattern_index = texture_pattern_index;
        data->texture_pattern_filename = NULL;
        data->subface_level = state->subface_level;

        if (texture_pattern_index >= 0) {
          struct prf_texture_s tex;

          if (prf_state_texture_lookup(state, texture_pattern_index, &tex)) {

            if (strlen(tex.filename)) {
              data->texture_pattern_filename =
                (char *)malloc(strlen(tex.filename)+1);
              strcpy(data->texture_pattern_filename, tex.filename);
            }
          }
        }
         data->material_index = material_index;
         data->transparency = transparency;
         data->lightmode = lightmode;

         if (prf_state_material_lookup(state, material_index,
                                       &data->material)) {
             // FIXME: implement proper action
         }
         else {
           set_default_material(&data->material);
         }

         array_append_ptr(facesets, data);
      }

      children = state->node->children;
      if (children) {
        int insub = 0;
        n = array_count(children);

        prf_state_push(state);
        for (i = 0; i < n; i++) {
          if (children[i]->opcode == PUSH_SUBFACE_OPCODE) insub = 1;
          if (!insub) prf_model_traverse_io_(children[i], state);
          if (children[i]->opcode == POP_SUBFACE_OPCODE) insub = 0;
        }
        prf_state_pop(state);

        prf_state_push(state);
        insub = 0;
        for (i = 0; i < n; i++) {
          if (children[i]->opcode == PUSH_SUBFACE_OPCODE) insub = 1;
          if (insub) prf_model_traverse_io_(children[i], state);
          if (children[i]->opcode == POP_SUBFACE_OPCODE) insub = 0;
        }
        prf_state_pop(state);
      }
    }
    return PRF_TRAV_SIBLING; /* finished traversing face */
  }

  if (is_in_face && state->node->opcode == VLIST_OPCODE) {
    uint32_t *ptr;
    n = prf_vertex_list_get_count(state->node);
    ptr = prf_vertex_list_get_list_ptr(state->node);
    for (i = 0; i < n; i++) {
      prf_model_vertex_palette_lookup((prf_model_t*)currmodel,
                                      ptr[i], &vertex);

      array_append_float(vertexarray, vertex.x);
      array_append_float(vertexarray, vertex.y);
      array_append_float(vertexarray, vertex.z);

      if (vertex.has_texture) {
        array_append_float(texcoordarray, vertex.texture[0]);
        array_append_float(texcoordarray, vertex.texture[1]);
      }
      else {
        array_append_float(texcoordarray, 0.0f);
        array_append_float(texcoordarray, 0.0f);
      }
      if (color_per_vertex) {
        if (vertex.flags & 0x2000) {
          array_append_int(colorarray, ((faceset*)facesets[current_index])->packed_color);
        }
        else if (vertex.flags & 0x1000) {
          array_append_int(colorarray, vertex.packed_color);
        }
        else {
          array_append_int(colorarray, my_palette_lookup(state, vertex.color_name_index));
        }
      }
    }
  }
  else if (is_in_face && state->node->opcode == MORPH_VLIST_OPCODE) {
    uint32_t *ptr;
    n = prf_morph_vertex_list_get_count(state->node) * 2;
    ptr = prf_morph_vertex_list_get_list_ptr(state->node);
    for (i = 0; i < n; i += 2) {
      prf_model_vertex_palette_lookup((prf_model_t*)currmodel,
                                       ptr[i], &vertex);

      array_append_float(vertexarray, vertex.x);
      array_append_float(vertexarray, vertex.y);
      array_append_float(vertexarray, vertex.z);

      if (vertex.has_texture) {
        array_append_float(texcoordarray, vertex.texture[0]);
        array_append_float(texcoordarray, vertex.texture[1]);
      }
      else {
        array_append_float(texcoordarray, 0.0f);
        array_append_float(texcoordarray, 0.0f);
      }
      if (color_per_vertex) {
        if (vertex.flags & 0x2000) {
          array_append_int(colorarray, ((faceset*)facesets[current_index])->packed_color);
        }
        else if (vertex.flags & 0x1000) {
          array_append_int(colorarray, vertex.packed_color);
        }
        else {
          array_append_int(colorarray,my_palette_lookup(state, vertex.color_name_index));
        }
      }
    }
  }

  else if (is_in_face && prf_vertex_lookup(state->node, &vertex)) {
    array_append_float(vertexarray, vertex.x);
    array_append_float(vertexarray, vertex.y);
    array_append_float(vertexarray, vertex.z);

    array_append_float(texcoordarray, 0.0f);
    array_append_float(texcoordarray, 0.0f);
    if (color_per_vertex) {
      if (vertex.flags & 0x2000) {
        array_append_int(colorarray, ((faceset*)facesets[current_index])->packed_color);
      }
      else if (vertex.flags & 0x1000) {
        array_append_int(colorarray, vertex.packed_color);
      }
      else {
        array_append_int(colorarray, my_palette_lookup(state, vertex.color_name_index));
      }
    }
  }

  else if (is_in_face && state->node->opcode == POP_OPCODE) {
    float *mat;
    is_in_face = 0;

    mat = (float*) prf_state_get_matrix(state);

    if (array_count(vertexarray) == 1*3) {
      /* points not supported yet */
    }
    else if (array_count(vertexarray) == 2*3) {
#define idx ((faceset*)facesets[current_index])->lineIndices
#define bsp ((faceset*)facesets[current_index])->bspTree
#define colbsp ((faceset*)facesets[current_index])->vertex_colors
#define colidx ((faceset*)facesets[current_index])->colorIdx

      get_coords_3d(vertexarray, 0, tmp);
      mult_matrix_vec(mat, tmp);
      array_append_int(idx, bsp_add_point(bsp, tmp));
      get_coords_3d(vertexarray, 1, tmp);
      mult_matrix_vec(mat, tmp);
      array_append_int(idx, bsp_add_point(bsp, tmp));
      array_append_int(idx, -1);

      if (color_per_vertex) {
        packed_to_vec(colorarray[0], tmp);
        array_append_int(colidx, bsp_add_point(colbsp, tmp));
        packed_to_vec(colorarray[1], tmp);
        array_append_int(colidx, bsp_add_point(colbsp, tmp));
        array_append_int(colidx, -1);
      }
#undef idx
#undef bsp
#undef colbsp
#undef colidx
    }
    else if (array_count(vertexarray) >= 3*3) {

      int dotex = ((faceset*)facesets[current_index])->texture_pattern_index >= 0;

      if (color_per_vertex) {
        assert(array_count(colorarray) == array_count(vertexarray)/3);
      }
      if (dotex) {
        /*
        assert(array_count(texcoordarray) == array_count(vertexarray));
        */
      }
#define idx ((faceset*)facesets[current_index])->indices
#define tidx ((faceset*)facesets[current_index])->texIndices
#define bsp ((faceset*)facesets[current_index])->bspTree
#define colbsp ((faceset*)facesets[current_index])->vertex_colors
#define colidx ((faceset*)facesets[current_index])->colorIdx
#define texcoords ((faceset*)facesets[current_index])->texcoords

      n = array_count(vertexarray) / 3;
      for (i = 0; i < n; i++) {
        get_coords_3d(vertexarray, i ,tmp);
        mult_matrix_vec(mat, tmp);
        array_append_int(idx, bsp_add_point(bsp, tmp));
        if (dotex) {
          get_coords_2d(texcoordarray, i, tmp);
          array_append_int(tidx, bsp_add_point(texcoords, tmp));

        }
        if (color_per_vertex) {
          packed_to_vec(colorarray[i], tmp);
          array_append_int(colidx, bsp_add_point(colbsp, tmp));
        }
      }
      array_append_int(idx, -1);
      if (dotex) array_append_int(tidx, -1);
      if (color_per_vertex) array_append_int(colidx, -1);
    }
#undef idx
#undef tidx
#undef bsp
#undef colbsp
#undef colidx
#undef texcoords
  }
  return PRF_TRAV_CONTINUE;
}